

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O0

void __thiscall
TEST_PluginTest_Sequence_Test::TEST_PluginTest_Sequence_Test(TEST_PluginTest_Sequence_Test *this)

{
  TEST_PluginTest_Sequence_Test *this_local;
  
  memset(this,0,0x30);
  TEST_GROUP_CppUTestGroupPluginTest::TEST_GROUP_CppUTestGroupPluginTest
            (&this->super_TEST_GROUP_CppUTestGroupPluginTest);
  (this->super_TEST_GROUP_CppUTestGroupPluginTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_PluginTest_Sequence_Test_003d7590;
  return;
}

Assistant:

TEST(PluginTest, Sequence)
{
    registry->installPlugin(thirdPlugin);
    genFixture->runAllTests();
    CHECK_EQUAL(1, thirdPlugin->preActionSequence);
    CHECK_EQUAL(2, firstPlugin->preActionSequence);
    CHECK_EQUAL(3, firstPlugin->postActionSequence);
    CHECK_EQUAL(4, thirdPlugin->postActionSequence);
    LONGS_EQUAL(2, registry->countPlugins());
}